

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O0

iterator * __thiscall boost::filesystem::path::begin(iterator *__return_storage_ptr__,path *this)

{
  bool bVar1;
  string_type local_58;
  size_type local_28;
  size_type element_size;
  path *local_18;
  path *this_local;
  iterator *itr;
  
  element_size._7_1_ = 0;
  local_18 = this;
  this_local = &__return_storage_ptr__->m_element;
  iterator::iterator(__return_storage_ptr__);
  __return_storage_ptr__->m_path_ptr = this;
  anon_unknown.dwarf_f716::first_element
            (&this->m_pathname,&__return_storage_ptr__->m_pos,&local_28,0xffffffffffffffff);
  std::__cxx11::string::substr((ulong)&local_58,(ulong)this);
  operator=(&__return_storage_ptr__->m_element,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          __return_storage_ptr__,(anonymous_namespace)::preferred_separator_string);
  if (bVar1) {
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,(anonymous_namespace)::separator_string);
  }
  return __return_storage_ptr__;
}

Assistant:

path::iterator path::begin() const
  {
    iterator itr;
    itr.m_path_ptr = this;
    size_type element_size;
    first_element(m_pathname, itr.m_pos, element_size);
    itr.m_element = m_pathname.substr(itr.m_pos, element_size);
    if (itr.m_element.m_pathname == preferred_separator_string)
      itr.m_element.m_pathname = separator_string;  // needed for Windows, harmless on POSIX
    return itr;
  }